

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr *ret)

{
  SQSharedState *ss;
  bool bVar1;
  SQWeakRef *root;
  SQClosure *x;
  undefined1 local_40 [8];
  SQObjectPtr func;
  SQObjectPtr *ret_local;
  SQREADFUNC read_local;
  SQUserPointer up_local;
  SQVM *v_local;
  
  func.super_SQObject._unVal = (SQObjectValue)ret;
  bVar1 = CheckTag(v,read,up,0x53514952);
  if (bVar1) {
    bVar1 = CheckTag(v,read,up,1);
    if (bVar1) {
      bVar1 = CheckTag(v,read,up,8);
      if (bVar1) {
        bVar1 = CheckTag(v,read,up,4);
        if (bVar1) {
          ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_40);
          bVar1 = SQFunctionProto::Load(v,up,read,(SQObjectPtr *)local_40);
          if (bVar1) {
            bVar1 = CheckTag(v,read,up,0x5441494c);
            if (bVar1) {
              ss = v->_sharedstate;
              root = SQRefCounted::GetWeakRef
                               ((v->_roottable).super_SQObject._unVal.pRefCounted,OT_TABLE);
              x = Create(ss,(SQFunctionProto *)func.super_SQObject._0_8_,root);
              ::SQObjectPtr::operator=((SQObjectPtr *)func.super_SQObject._unVal.pTable,x);
              v_local._7_1_ = true;
            }
            else {
              v_local._7_1_ = false;
            }
          }
          else {
            v_local._7_1_ = false;
          }
          ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_40);
        }
        else {
          v_local._7_1_ = false;
        }
      }
      else {
        v_local._7_1_ = false;
      }
    }
    else {
      v_local._7_1_ = false;
    }
  }
  else {
    v_local._7_1_ = false;
  }
  return v_local._7_1_;
}

Assistant:

bool SQClosure::Load(SQVM *v,SQUserPointer up,SQREADFUNC read,SQObjectPtr &ret)
{
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_HEAD));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQChar)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQInteger)));
    _CHECK_IO(CheckTag(v,read,up,sizeof(SQFloat)));
    SQObjectPtr func;
    _CHECK_IO(SQFunctionProto::Load(v,up,read,func));
    _CHECK_IO(CheckTag(v,read,up,SQ_CLOSURESTREAM_TAIL));
    ret = SQClosure::Create(_ss(v),_funcproto(func),_table(v->_roottable)->GetWeakRef(OT_TABLE));
    //FIXME: load an root for this closure
    return true;
}